

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_AllTriplets_TestShell::
TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_AllTriplets_TestShell
          (TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_AllTriplets_TestShell *this)

{
  TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_AllTriplets_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_AllTriplets_TestShell_00255370;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTerminalsAndHornors_AllTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::NorthWind, true);
	addTriplet(Tile::OneOfCharacters, true);
	addTriplet(Tile::NineOfCircles, false);
	addTriplet(Tile::NineOfBamboos, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTerminalsAndHornors));
	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTriplets));
	CHECK_EQUAL(0, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(4, r.doubling_factor);
}